

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O0

void __thiscall brown::Tile::drawline(Tile *this,float x0,float y0,float x1,float y1,uint32_t col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int local_44;
  int ipy [2];
  int ipx [2];
  int y;
  int x;
  int i;
  float f;
  uint32_t col_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  Tile *this_local;
  
  if (0.0 <= x0) {
    y1_local = y0;
    x1_local = x0;
    if ((float)this->x < x0) {
      if ((float)this->x < x1) {
        return;
      }
      y1_local = (((float)this->x - x0) * (y1 - y0)) / (x1 - x0) + y0;
      x1_local = (float)this->x;
    }
  }
  else {
    if (x1 < 0.0) {
      return;
    }
    y1_local = ((0.0 - x0) * (y1 - y0)) / (x1 - x0) + y0;
    x1_local = 0.0;
  }
  if (0.0 <= y1_local) {
    if ((float)this->y < y1_local) {
      if ((float)this->y < y1) {
        return;
      }
      x1_local = (((float)this->y - y1_local) * (x1 - x1_local)) / (y1 - y1_local) + x1_local;
      y1_local = (float)this->y;
    }
  }
  else {
    if (y1 < 0.0) {
      return;
    }
    x1_local = ((0.0 - y1_local) * (x1 - x1_local)) / (y1 - y1_local) + x1_local;
    y1_local = 0.0;
  }
  if (0.0 <= x1) {
    f = y1;
    col_local = (uint32_t)x1;
    if ((float)this->x < x1) {
      f = (((float)this->x - x1) * (y1 - y1_local)) / (x1 - x1_local) + y1;
      col_local = (uint32_t)(float)this->x;
    }
  }
  else {
    f = ((0.0 - x1) * (y1 - y1_local)) / (x1 - x1_local) + y1;
    col_local = 0;
  }
  if (0.0 <= f) {
    if ((float)this->y < f) {
      col_local = (uint32_t)
                  ((((float)this->y - f) * ((float)col_local - x1_local)) / (f - y1_local) +
                  (float)col_local);
      f = (float)this->y;
    }
  }
  else {
    col_local = (uint32_t)
                (((0.0 - f) * ((float)col_local - x1_local)) / (f - y1_local) + (float)col_local);
    f = 0.0;
  }
  fVar1 = (float)col_local - x1_local;
  fVar2 = f - y1_local;
  fVar3 = fVar2;
  if (ABS(fVar2) < ABS(fVar1)) {
    fVar3 = fVar1;
  }
  y = (int)ABS(fVar3);
  if ((y & 0x7fffffffU) != 0) {
    fVar3 = (float)y;
    ipy[0] = (int)(x1_local * 65536.0);
    local_44 = (int)(y1_local * 65536.0);
    for (; 0 < y; y = y + -1) {
      if (((uint)(ipy[0] >> 0x10) < (uint)this->x) && ((uint)(local_44 >> 0x10) < (uint)this->y)) {
        *(uint32_t *)((long)(this->p * (local_44 >> 0x10) + (ipy[0] >> 0x10) * 4) + this->f) = col;
      }
      ipy[0] = (int)(fVar1 * (65536.0 / fVar3)) + ipy[0];
      local_44 = (int)(fVar2 * (65536.0 / fVar3)) + local_44;
    }
  }
  return;
}

Assistant:

void Tile::drawline (float x0, float y0, float x1, float y1, std::uint32_t col)
{
    float f;
    int i, x, y, ipx[2], ipy[2];

    if (x0 <   0.f) { if (x1 <   0.f) return; y0 = (         0.f-x0)*(y1-y0)/(x1-x0)+y0; x0 =          0.f; } else
    if (x0 > this->x) { if (x1 > this->x) return; y0 = ((float)this->x-x0)*(y1-y0)/(x1-x0)+y0; x0 = (float)this->x; }
    if (y0 <   0.f) { if (y1 <   0.f) return; x0 = (         0.f-y0)*(x1-x0)/(y1-y0)+x0; y0 =          0.f; } else
    if (y0 > this->y) { if (y1 > this->y) return; x0 = ((float)this->y-y0)*(x1-x0)/(y1-y0)+x0; y0 = (float)this->y; }
    if (x1 <   0.f) {                         y1 = (         0.f-x1)*(y1-y0)/(x1-x0)+y1; x1 =          0.f; } else
    if (x1 > this->x) {                         y1 = ((float)this->x-x1)*(y1-y0)/(x1-x0)+y1; x1 = (float)this->x; }
    if (y1 <   0.f) {                         x1 = (         0.f-y1)*(x1-x0)/(y1-y0)+x1; y1 =          0.f; } else
    if (y1 > this->y) {                         x1 = ((float)this->y-y1)*(x1-x0)/(y1-y0)+x1; y1 = (float)this->y; }

    x1 -= x0; y1 -= y0;
    i = (int)max(fabs(x1),fabs(y1)); if (!(i&0x7fffffff)) return;/*FUK:32-bit!*/
    f = 65536.f/(float)i;
    ipx[0] = (int)(x0*65536.0); ipx[1] = (int)(x1*f);
    ipy[0] = (int)(y0*65536.0); ipy[1] = (int)(y1*f);
    for(;i>0;i--)
    {
        x = (ipx[0]>>16); y = (ipy[0]>>16);
        if (((unsigned)x < (unsigned)this->x) && ((unsigned)y < (unsigned)this->y))
            *(std::uint32_t *)(this->p*y + (x<<2) + this->f) = col;
        ipx[0] += ipx[1]; ipy[0] += ipy[1];
    }
}